

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

bool __thiscall UI::renderUser(UI *this,User *user,int width,bool selected)

{
  bool bVar1;
  bool bVar2;
  int count;
  ImVec2 p0;
  ImVec2 local_38;
  ImVec2 local_30;
  
  ImGui::PushID((user->username)._M_dataplus._M_p);
  local_38 = ImGui::GetCursorScreenPos();
  local_30.x = (float)width;
  local_30.y = 1.0;
  bVar1 = ImGui::Button("##but",&local_30);
  count = 0;
  bVar2 = ImGui::IsItemHovered(0);
  if ((bVar2 || selected) || (user->hasUnread == true)) {
    ImGui::PushStyleColor(0,&(this->colors).userActiveFG);
    count = 1;
  }
  ImGui::SetCursorScreenPos(&local_38);
  renderOnlineIndicator(this,"o",user->isOnline);
  ImGui::SameLine(0.0,-1.0);
  ImGui::Text("%s",(user->username)._M_dataplus._M_p);
  ImGui::PopStyleColor(count);
  ImGui::PopID();
  return bVar1;
}

Assistant:

bool UI::renderUser(const User & user, int width, bool selected) {
    int npop = 0;
    bool result = false;

    ImGui::PushID(user.username.c_str());
    const auto p0 = ImGui::GetCursorScreenPos();
    if (ImGui::Button("##but", ImVec2(width, 1))) {
        result = true;
    }
    if (ImGui::IsItemHovered() || selected || user.hasUnread) {
        ImGui::PushStyleColor(ImGuiCol_Text, colors.userActiveFG);
        ++npop;
    }
    ImGui::SetCursorScreenPos(p0);
    renderOnlineIndicator("o", user.isOnline);
    ImGui::SameLine();
    ImGui::Text("%s", user.username.c_str());
    ImGui::PopStyleColor(npop);
    ImGui::PopID();

    return result;
}